

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_uint64 ma_resampler_get_required_input_frame_count
                    (ma_resampler *pResampler,ma_uint64 outputFrameCount)

{
  if (outputFrameCount == 0 || pResampler == (ma_resampler *)0x0) {
    return 0;
  }
  if ((pResampler->config).algorithm == ma_resample_algorithm_linear) {
    return ((ulong)(pResampler->state).linear.inAdvanceFrac * (outputFrameCount - 1) +
           (ulong)(pResampler->state).linear.inTimeFrac) /
           (ulong)(pResampler->state).linear.config.sampleRateOut +
           (ulong)(pResampler->state).linear.inAdvanceInt * (outputFrameCount - 1) +
           (ulong)(pResampler->state).linear.inTimeInt;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                ,0x8346,
                "ma_uint64 ma_resampler_get_required_input_frame_count(ma_resampler *, ma_uint64)");
}

Assistant:

MA_API ma_uint64 ma_resampler_get_required_input_frame_count(ma_resampler* pResampler, ma_uint64 outputFrameCount)
{
    if (pResampler == NULL) {
        return 0;
    }

    if (outputFrameCount == 0) {
        return 0;
    }

    switch (pResampler->config.algorithm)
    {
        case ma_resample_algorithm_linear:
        {
            return ma_linear_resampler_get_required_input_frame_count(&pResampler->state.linear, outputFrameCount);
        }

        case ma_resample_algorithm_speex:
        {
        #if defined(MA_HAS_SPEEX_RESAMPLER)
            ma_uint64 count;
            int speexErr = ma_speex_resampler_get_required_input_frame_count((SpeexResamplerState*)pResampler->state.speex.pSpeexResamplerState, outputFrameCount, &count);
            if (speexErr != RESAMPLER_ERR_SUCCESS) {
                return 0;
            }

            return count;
        #else
            break;
        #endif
        }

        default: break;
    }

    /* Should never get here. */
    MA_ASSERT(MA_FALSE);
    return 0;
}